

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Gudhi::zigzag_persistence::Zigzag_matrix_options<(Gudhi::persistence_matrix::Column_types)4>_>_>
::remove_maximal_cell
          (Chain_matrix<Gudhi::persistence_matrix::Matrix<Gudhi::zigzag_persistence::Zigzag_matrix_options<(Gudhi::persistence_matrix::Column_types)4>_>_>
           *this,ID_index cellID,vector<unsigned_int,_std::allocator<unsigned_int>_> *columnsToSwap)

{
  pointer puVar1;
  undefined4 in_EAX;
  mapped_type lastIndex;
  mapped_type *pmVar2;
  pointer puVar3;
  ID_index i;
  uint local_38;
  ID_index local_34;
  
  _local_38 = CONCAT44(cellID,in_EAX);
  pmVar2 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&this->pivotToColumnIndex_,&local_34);
  lastIndex = *pmVar2;
  puVar1 = (columnsToSwap->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar3 = (columnsToSwap->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    _local_38 = CONCAT44(local_34,*puVar3);
    pmVar2 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->pivotToColumnIndex_,&local_38);
    lastIndex = Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Gudhi::zigzag_persistence::Zigzag_matrix_options<(Gudhi::persistence_matrix::Column_types)4>_>_>
                ::vine_swap(&this->super_Chain_vine_swap_option,lastIndex,*pmVar2);
  }
  _remove_last(this,lastIndex);
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::remove_maximal_cell(ID_index cellID,
                                                             const std::vector<ID_index>& columnsToSwap)
{
  static_assert(Master_matrix::Option_list::has_removable_columns,
                "'remove_maximal_cell' is not implemented for the chosen options.");
  static_assert(Master_matrix::Option_list::has_map_column_container && Master_matrix::Option_list::has_vine_update,
                "'remove_maximal_cell' is not implemented for the chosen options.");

  // TODO: find simple test to verify that col at columnIndex is maximal even without row access.

  Index startIndex = pivotToColumnIndex_.at(cellID);

  for (ID_index i : columnsToSwap) {
    startIndex = Swap_opt::vine_swap(startIndex, pivotToColumnIndex_.at(i));
  }

  _remove_last(startIndex);
}